

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprNeedsNoAffinityChange(Expr *p,char aff)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  
  iVar2 = 1;
  if (aff != 'A') {
    bVar1 = false;
    while (bVar3 = p->op, bVar3 - 0xad < 2) {
      if (bVar3 == 0xae) {
        bVar1 = true;
      }
      p = p->pLeft;
    }
    if (bVar3 == 0xb0) {
      bVar3 = p->op2;
    }
    iVar2 = 0;
    if (bVar3 < 0x9b) {
      if (bVar3 == 0x76) {
        return (int)(aff == 'B' && !bVar1);
      }
      if (bVar3 == 0x9a) {
LAB_001a14da:
        return (int)('B' < aff);
      }
    }
    else {
      if (bVar3 == 0x9b) {
        return (int)!bVar1;
      }
      if (bVar3 == 0xa8) {
        if ('B' < aff) {
          return (uint)((ushort)p->iColumn >> 0xf);
        }
      }
      else if (bVar3 == 0x9c) goto LAB_001a14da;
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprNeedsNoAffinityChange(const Expr *p, char aff){
  u8 op;
  int unaryMinus = 0;
  if( aff==SQLITE_AFF_BLOB ) return 1;
  while( p->op==TK_UPLUS || p->op==TK_UMINUS ){
    if( p->op==TK_UMINUS ) unaryMinus = 1;
    p = p->pLeft;
  }
  op = p->op;
  if( op==TK_REGISTER ) op = p->op2;
  switch( op ){
    case TK_INTEGER: {
      return aff>=SQLITE_AFF_NUMERIC;
    }
    case TK_FLOAT: {
      return aff>=SQLITE_AFF_NUMERIC;
    }
    case TK_STRING: {
      return !unaryMinus && aff==SQLITE_AFF_TEXT;
    }
    case TK_BLOB: {
      return !unaryMinus;
    }
    case TK_COLUMN: {
      assert( p->iTable>=0 );  /* p cannot be part of a CHECK constraint */
      return aff>=SQLITE_AFF_NUMERIC && p->iColumn<0;
    }
    default: {
      return 0;
    }
  }
}